

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall google::protobuf::FileDescriptorProto::Clear(FileDescriptorProto *this)

{
  uint uVar1;
  LogMessage *pLVar2;
  string *psVar3;
  FileOptions *this_00;
  SourceCodeInfo *this_01;
  LogFinisher local_49;
  LogMessage local_48;
  
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->dependency_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
            (&(this->message_type_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
            (&(this->enum_type_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
            (&(this->service_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
            (&(this->extension_).super_RepeatedPtrFieldBase);
  (this->public_dependency_).current_size_ = 0;
  (this->weak_dependency_).current_size_ = 0;
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 0x1f) != 0) {
    if ((uVar1 & 1) != 0) {
      psVar3 = (this->name_).ptr_;
      if (psVar3 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::LogMessage::LogMessage
                  (&local_48,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x56e);
        pLVar2 = internal::LogMessage::operator<<
                           (&local_48,
                            "CHECK failed: !name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(&local_49,pLVar2);
        internal::LogMessage::~LogMessage(&local_48);
        psVar3 = (this->name_).ptr_;
      }
      psVar3->_M_string_length = 0;
      *(psVar3->_M_dataplus)._M_p = '\0';
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 2) != 0) {
      psVar3 = (this->package_).ptr_;
      if (psVar3 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::LogMessage::LogMessage
                  (&local_48,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x572);
        pLVar2 = internal::LogMessage::operator<<
                           (&local_48,
                            "CHECK failed: !package_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(&local_49,pLVar2);
        internal::LogMessage::~LogMessage(&local_48);
        psVar3 = (this->package_).ptr_;
      }
      psVar3->_M_string_length = 0;
      *(psVar3->_M_dataplus)._M_p = '\0';
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 4) != 0) {
      psVar3 = (this->syntax_).ptr_;
      if (psVar3 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::LogMessage::LogMessage
                  (&local_48,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x576);
        pLVar2 = internal::LogMessage::operator<<
                           (&local_48,
                            "CHECK failed: !syntax_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(&local_49,pLVar2);
        internal::LogMessage::~LogMessage(&local_48);
        psVar3 = (this->syntax_).ptr_;
      }
      psVar3->_M_string_length = 0;
      *(psVar3->_M_dataplus)._M_p = '\0';
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 8) != 0) {
      this_00 = this->options_;
      if (this_00 == (FileOptions *)0x0) {
        internal::LogMessage::LogMessage
                  (&local_48,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x57a);
        pLVar2 = internal::LogMessage::operator<<(&local_48,"CHECK failed: options_ != NULL: ");
        internal::LogFinisher::operator=(&local_49,pLVar2);
        internal::LogMessage::~LogMessage(&local_48);
        this_00 = this->options_;
      }
      FileOptions::Clear(this_00);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 0x10) != 0) {
      this_01 = this->source_code_info_;
      if (this_01 == (SourceCodeInfo *)0x0) {
        internal::LogMessage::LogMessage
                  (&local_48,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x57e);
        pLVar2 = internal::LogMessage::operator<<
                           (&local_48,"CHECK failed: source_code_info_ != NULL: ");
        internal::LogFinisher::operator=(&local_49,pLVar2);
        internal::LogMessage::~LogMessage(&local_48);
        this_01 = this->source_code_info_;
      }
      SourceCodeInfo::Clear(this_01);
    }
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void FileDescriptorProto::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.FileDescriptorProto)
  dependency_.Clear();
  message_type_.Clear();
  enum_type_.Clear();
  service_.Clear();
  extension_.Clear();
  public_dependency_.Clear();
  weak_dependency_.Clear();
  if (_has_bits_[0 / 32] & 31u) {
    if (has_name()) {
      GOOGLE_DCHECK(!name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*name_.UnsafeRawStringPointer())->clear();
    }
    if (has_package()) {
      GOOGLE_DCHECK(!package_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*package_.UnsafeRawStringPointer())->clear();
    }
    if (has_syntax()) {
      GOOGLE_DCHECK(!syntax_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*syntax_.UnsafeRawStringPointer())->clear();
    }
    if (has_options()) {
      GOOGLE_DCHECK(options_ != NULL);
      options_->::google::protobuf::FileOptions::Clear();
    }
    if (has_source_code_info()) {
      GOOGLE_DCHECK(source_code_info_ != NULL);
      source_code_info_->::google::protobuf::SourceCodeInfo::Clear();
    }
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}